

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBSTest_BitString_Test::TestBody(CBSTest_BitString_Test *this)

{
  long *plVar1;
  int iVar2;
  uint *message;
  long lVar3;
  char *message_00;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  initializer_list<unsigned_char> __l_16;
  initializer_list<unsigned_char> __l_17;
  initializer_list<unsigned_char> __l_18;
  initializer_list<unsigned_char> __l_19;
  initializer_list<unsigned_char> __l_20;
  initializer_list<unsigned_char> __l_21;
  initializer_list<unsigned_char> __l_22;
  initializer_list<unsigned_char> __l_23;
  ScopedTrace gtest_trace_1256;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_1308;
  CBS cbs;
  CBS cbs_2;
  undefined2 local_bb;
  undefined1 local_b9;
  AssertHelper local_b8;
  Message local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  string local_88;
  allocator_type local_63;
  allocator_type local_62;
  allocator_type local_61;
  allocator_type local_60;
  allocator_type local_5f;
  allocator_type local_5e;
  allocator_type local_5d;
  undefined2 local_5c;
  undefined1 local_5a;
  allocator_type local_59;
  undefined2 local_58;
  undefined1 local_56;
  allocator_type local_55;
  allocator_type local_54;
  allocator_type local_53;
  allocator_type local_52;
  allocator_type local_51;
  allocator_type local_50;
  allocator_type local_4f;
  allocator_type local_4e;
  uchar local_4d;
  undefined2 local_4c;
  undefined1 local_4a;
  undefined2 local_49;
  undefined1 local_47;
  uchar local_46 [14];
  long local_38;
  
  if ((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                 kValidBitStrings);
    if (iVar2 != 0) {
      local_a0.data_._0_2_ = (ushort)local_a0.data_ & 0xff00;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_a0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings,__l,(allocator_type *)&local_bb);
      local_98._0_2_ = 0x8007;
      __l_00._M_len = 2;
      __l_00._M_array = local_98;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 1,__l_00,(allocator_type *)&local_58);
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)0x4;
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_1_ = 0xf0;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&local_b0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 2,__l_01,(allocator_type *)&local_5c);
      local_b8.data_._0_1_ = 0;
      local_b8.data_._1_1_ = 0xff;
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)&local_b8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 3,__l_02,(allocator_type *)&local_49);
      local_88._M_dataplus._M_p._0_7_ = 0xc0ffffffffff06;
      __l_03._M_len = 7;
      __l_03._M_array = (iterator)&local_88;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 4,__l_03,(allocator_type *)&local_4c);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                           kValidBitStrings);
    }
  }
  lVar3 = 8;
  do {
    local_88._M_dataplus._M_p = *(pointer *)(lVar3 + 0x7203b8);
    local_88._M_string_length =
         *(long *)((long)&TestBody::kValidBitStrings[0].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar3) -
         (long)local_88._M_dataplus._M_p;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_bb,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4e8,(Bytes *)&local_88);
    local_98 = *(undefined1 (*) [8])(lVar3 + 0x7203b8);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)((long)&TestBody::kValidBitStrings[0].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar3) - (long)local_98)
    ;
    iVar2 = CBS_is_valid_asn1_bitstring((CBS *)local_98);
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_b0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)&local_b0,
                 (AssertionResult *)"CBS_is_valid_asn1_bitstring(&cbs)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4eb,local_88._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      plVar1 = (long *)CONCAT44(local_b8.data_._4_4_,
                                CONCAT13(local_b8.data_._3_1_,
                                         CONCAT12(local_b8.data_._2_1_,
                                                  CONCAT11(local_b8.data_._1_1_,local_b8.data_._0_1_
                                                          ))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_bb);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x80);
  if ((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kInvalidBitStrings == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                 kInvalidBitStrings);
    if (iVar2 != 0) {
      TestBody::kInvalidBitStrings[0].
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kInvalidBitStrings[0].
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      TestBody::kInvalidBitStrings[0].
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.data_._0_1_ = 1;
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&local_b8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 1,__l_04,(allocator_type *)&local_a0);
      local_98._0_2_ = 0xff08;
      __l_05._M_len = 2;
      __l_05._M_array = local_98;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 2,__l_05,(allocator_type *)&local_bb);
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)0xff;
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_1_ = 0xff;
      __l_06._M_len = 2;
      __l_06._M_array = (iterator)&local_b0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 3,__l_06,(allocator_type *)&local_58);
      local_88._M_dataplus._M_p._0_3_ = 0xc1ff06;
      __l_07._M_len = 3;
      __l_07._M_array = (iterator)&local_88;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 4,__l_07,(allocator_type *)&local_5c);
      __cxa_atexit(__cxx_global_array_dtor_401,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                           kInvalidBitStrings);
    }
  }
  lVar3 = 8;
  do {
    local_88._M_dataplus._M_p =
         *(pointer *)
          (&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings + lVar3);
    local_88._M_string_length =
         *(long *)((long)&TestBody::kInvalidBitStrings[0].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar3) -
         (long)local_88._M_dataplus._M_p;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_bb,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4fa,(Bytes *)&local_88);
    local_98 = *(undefined1 (*) [8])
                (&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings +
                lVar3);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)((long)&TestBody::kInvalidBitStrings[0].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar3) - (long)local_98)
    ;
    iVar2 = CBS_is_valid_asn1_bitstring((CBS *)local_98);
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_b0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)&local_b0,
                 (AssertionResult *)"CBS_is_valid_asn1_bitstring(&cbs)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4fd,local_88._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      plVar1 = (long *)CONCAT44(local_b8.data_._4_4_,
                                CONCAT13(local_b8.data_._3_1_,
                                         CONCAT12(local_b8.data_._2_1_,
                                                  CONCAT11(local_b8.data_._1_1_,local_b8.data_._0_1_
                                                          ))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    iVar2 = CBS_asn1_bitstring_has_bit((CBS *)local_98,0);
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_b0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)&local_b0,
                 (AssertionResult *)"CBS_asn1_bitstring_has_bit(&cbs, 0)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x500,local_88._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      plVar1 = (long *)CONCAT44(local_b8.data_._4_4_,
                                CONCAT13(local_b8.data_._3_1_,
                                         CONCAT12(local_b8.data_._2_1_,
                                                  CONCAT11(local_b8.data_._1_1_,local_b8.data_._0_1_
                                                          ))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_bb);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x80);
  if ((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                 kBitTests);
    if (iVar2 != 0) {
      local_4d = '\0';
      __l_08._M_len = 1;
      __l_08._M_array = &local_4d;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0].in,__l_08,&local_4e);
      TestBody::kBitTests[0].bit = 0;
      TestBody::kBitTests[0].bit_set = false;
      local_46[0] = '\a';
      local_46[1] = 0x80;
      __l_09._M_len = 2;
      __l_09._M_array = local_46;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[1].in,__l_09,&local_4f);
      TestBody::kBitTests[1].bit = 0;
      TestBody::kBitTests[1].bit_set = true;
      local_88._M_dataplus._M_p._0_3_ = 0x400f06;
      __l_10._M_len = 3;
      __l_10._M_array = (iterator)&local_88;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[2].in,__l_10,&local_50);
      TestBody::kBitTests[2].bit = 0;
      TestBody::kBitTests[2].bit_set = false;
      local_98._0_3_ = 0x400f06;
      __l_11._M_len = 3;
      __l_11._M_array = local_98;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[3].in,__l_11,&local_51);
      TestBody::kBitTests[3].bit = 1;
      TestBody::kBitTests[3].bit_set = false;
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)0x6;
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_1_ = 0xf;
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._2_1_ = 0x40;
      __l_12._M_len = 3;
      __l_12._M_array = (iterator)&local_b0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[4].in,__l_12,&local_52);
      TestBody::kBitTests[4].bit = 2;
      TestBody::kBitTests[4].bit_set = false;
      local_b8.data_._0_1_ = 6;
      local_b8.data_._1_1_ = 0xf;
      local_b8.data_._2_1_ = 0x40;
      __l_13._M_len = 3;
      __l_13._M_array = (iterator)&local_b8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[5].in,__l_13,&local_53);
      TestBody::kBitTests[5].bit = 3;
      TestBody::kBitTests[5].bit_set = false;
      local_a0.data_._0_2_ = 0xf06;
      local_a0.data_._2_1_ = 0x40;
      __l_14._M_len = 3;
      __l_14._M_array = (iterator)&local_a0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[6].in,__l_14,&local_54);
      TestBody::kBitTests[6].bit = 4;
      TestBody::kBitTests[6].bit_set = true;
      local_bb = 0xf06;
      local_b9 = 0x40;
      __l_15._M_len = 3;
      __l_15._M_array = (iterator)&local_bb;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[7].in,__l_15,&local_55);
      TestBody::kBitTests[7].bit = 5;
      TestBody::kBitTests[7].bit_set = true;
      local_58 = 0xf06;
      local_56 = 0x40;
      __l_16._M_len = 3;
      __l_16._M_array = (iterator)&local_58;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[8].in,__l_16,&local_59);
      TestBody::kBitTests[8].bit = 6;
      TestBody::kBitTests[8].bit_set = true;
      local_5c = 0xf06;
      local_5a = 0x40;
      __l_17._M_len = 3;
      __l_17._M_array = (iterator)&local_5c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[9].in,__l_17,&local_5d);
      TestBody::kBitTests[9].bit = 7;
      TestBody::kBitTests[9].bit_set = true;
      local_49 = 0xf06;
      local_47 = 0x40;
      __l_18._M_len = 3;
      __l_18._M_array = (iterator)&local_49;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[10].in,__l_18,&local_5e);
      TestBody::kBitTests[10].bit = 8;
      TestBody::kBitTests[10].bit_set = false;
      local_4c = 0xf06;
      local_4a = 0x40;
      __l_19._M_len = 3;
      __l_19._M_array = (iterator)&local_4c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xb].in,__l_19,&local_5f);
      TestBody::kBitTests[0xb].bit = 9;
      TestBody::kBitTests[0xb].bit_set = true;
      local_46[0xb] = '\x06';
      local_46[0xc] = '\x0f';
      local_46[0xd] = 0x40;
      __l_20._M_len = 3;
      __l_20._M_array = local_46 + 0xb;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xc].in,__l_20,&local_60);
      TestBody::kBitTests[0xc].bit = 10;
      TestBody::kBitTests[0xc].bit_set = false;
      local_46[8] = '\x06';
      local_46[9] = '\x0f';
      local_46[10] = 0x40;
      __l_21._M_len = 3;
      __l_21._M_array = local_46 + 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xd].in,__l_21,&local_61);
      TestBody::kBitTests[0xd].bit = 0xf;
      TestBody::kBitTests[0xd].bit_set = false;
      local_46[5] = '\x06';
      local_46[6] = '\x0f';
      local_46[7] = 0x40;
      __l_22._M_len = 3;
      __l_22._M_array = local_46 + 5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xe].in,__l_22,&local_62);
      TestBody::kBitTests[0xe].bit = 0x10;
      TestBody::kBitTests[0xe].bit_set = false;
      local_46[2] = '\x06';
      local_46[3] = '\x0f';
      local_46[4] = 0x40;
      __l_23._M_len = 3;
      __l_23._M_array = local_46 + 2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xf].in,__l_23,&local_63);
      TestBody::kBitTests[0xf].bit = 1000;
      TestBody::kBitTests[0xf].bit_set = false;
      __cxa_atexit(__cxx_global_array_dtor_403,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests);
    }
  }
  message = &TestBody::kBitTests[0].bit;
  local_38 = 0x200;
  do {
    local_88._M_dataplus._M_p =
         (pointer)(((anon_struct_32_3_50c92611 *)(message + -6))->in).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_88._M_string_length = (long)*(pointer *)(message + -4) - (long)local_88._M_dataplus._M_p;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x51c,(Bytes *)&local_88);
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              ((ScopedTrace *)&local_bb,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x51d,message);
    local_88._M_dataplus._M_p =
         (pointer)(((anon_struct_32_3_50c92611 *)(message + -6))->in).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_88._M_string_length = (long)*(pointer *)(message + -4) - (long)local_88._M_dataplus._M_p;
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = *(internal *)(message + 1);
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._1_1_ = 0;
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._2_1_ = 0;
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._3_1_ = 0;
    iVar2 = CBS_asn1_bitstring_has_bit((CBS *)&local_88,*message);
    local_b8.data_._0_1_ = (undefined1)iVar2;
    local_b8.data_._1_1_ = (undefined1)((uint)iVar2 >> 8);
    local_b8.data_._2_1_ = (undefined1)((uint)iVar2 >> 0x10);
    local_b8.data_._3_1_ = (undefined1)((uint)iVar2 >> 0x18);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_98,"static_cast<int>(test.bit_set)",
               "CBS_asn1_bitstring_has_bit(&cbs, test.bit)",(int *)&local_b0,(int *)&local_b8);
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message(&local_b0);
      message_00 = "";
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x521,message_00);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      plVar1 = (long *)CONCAT44(local_b0.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                CONCAT13(local_b0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._3_1_,
                                         CONCAT12(local_b0.ss_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._2_1_,
                                                  CONCAT11(local_b0.ss_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._1_1_,
                                                  local_b0.ss_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    lVar3 = local_38;
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_bb);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_a0);
    message = message + 8;
    local_38 = lVar3 + -0x20;
  } while (local_38 != 0);
  return;
}

Assistant:

TEST(CBSTest, BitString) {
  static const std::vector<uint8_t> kValidBitStrings[] = {
      {0x00},                                      // 0 bits
      {0x07, 0x80},                                // 1 bit
      {0x04, 0xf0},                                // 4 bits
      {0x00, 0xff},                                // 8 bits
      {0x06, 0xff, 0xff, 0xff, 0xff, 0xff, 0xc0},  // 42 bits
  };
  for (const auto &test : kValidBitStrings) {
    SCOPED_TRACE(Bytes(test.data(), test.size()));
    CBS cbs;
    CBS_init(&cbs, test.data(), test.size());
    EXPECT_TRUE(CBS_is_valid_asn1_bitstring(&cbs));
  }

  static const std::vector<uint8_t> kInvalidBitStrings[] = {
      // BIT STRINGs always have a leading byte.
      std::vector<uint8_t>{},
      // It's not possible to take an unused bit off the empty string.
      {0x01},
      // There can be at most 7 unused bits.
      {0x08, 0xff},
      {0xff, 0xff},
      // All unused bits must be cleared.
      {0x06, 0xff, 0xc1},
  };
  for (const auto &test : kInvalidBitStrings) {
    SCOPED_TRACE(Bytes(test.data(), test.size()));
    CBS cbs;
    CBS_init(&cbs, test.data(), test.size());
    EXPECT_FALSE(CBS_is_valid_asn1_bitstring(&cbs));

    // CBS_asn1_bitstring_has_bit returns false on invalid inputs.
    EXPECT_FALSE(CBS_asn1_bitstring_has_bit(&cbs, 0));
  }

  static const struct {
    std::vector<uint8_t> in;
    unsigned bit;
    bool bit_set;
  } kBitTests[] = {
      // Basic tests.
      {{0x00}, 0, false},
      {{0x07, 0x80}, 0, true},
      {{0x06, 0x0f, 0x40}, 0, false},
      {{0x06, 0x0f, 0x40}, 1, false},
      {{0x06, 0x0f, 0x40}, 2, false},
      {{0x06, 0x0f, 0x40}, 3, false},
      {{0x06, 0x0f, 0x40}, 4, true},
      {{0x06, 0x0f, 0x40}, 5, true},
      {{0x06, 0x0f, 0x40}, 6, true},
      {{0x06, 0x0f, 0x40}, 7, true},
      {{0x06, 0x0f, 0x40}, 8, false},
      {{0x06, 0x0f, 0x40}, 9, true},
      // Out-of-bounds bits return 0.
      {{0x06, 0x0f, 0x40}, 10, false},
      {{0x06, 0x0f, 0x40}, 15, false},
      {{0x06, 0x0f, 0x40}, 16, false},
      {{0x06, 0x0f, 0x40}, 1000, false},
  };
  for (const auto &test : kBitTests) {
    SCOPED_TRACE(Bytes(test.in.data(), test.in.size()));
    SCOPED_TRACE(test.bit);
    CBS cbs;
    CBS_init(&cbs, test.in.data(), test.in.size());
    EXPECT_EQ(static_cast<int>(test.bit_set),
              CBS_asn1_bitstring_has_bit(&cbs, test.bit));
  }
}